

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

ctmbstr FontSize2Name(ctmbstr size)

{
  int n_2;
  int n_1;
  int n;
  ctmbstr size_local;
  
  if (*size == '\0') {
    size_local = (ctmbstr)0x0;
  }
  else if ((*size < '0') || ('6' < *size)) {
    if (*size == '-') {
      if ((size[1] < '0') || ('6' < size[1])) {
        size_local = "smaller";
      }
      else {
        size_local = FontSize2Name::minussizes[size[1] + -0x30];
      }
    }
    else if ((size[1] < '0') || ('6' < size[1])) {
      size_local = "larger";
    }
    else {
      size_local = FontSize2Name::plussizes[size[1] + -0x30];
    }
  }
  else {
    size_local = FontSize2Name::sizes[*size + -0x30];
  }
  return size_local;
}

Assistant:

static ctmbstr FontSize2Name(ctmbstr size)
{
    static const ctmbstr sizes[7] =
    {
        "60%", "70%", "80%", NULL,
        "120%", "150%", "200%"
    };

    /* increment of 0.8 */
    static const ctmbstr minussizes[] =
    {
        "100%", "80%", "64%", "51%",
        "40%", "32%", "26%"
    };

    /* increment of 1.2 */
    static const ctmbstr plussizes[] =
    {
        "100%", "120%", "144%", "172%",
        "207%", "248%", "298%"
    };

    if (size[0] == '\0')
        return NULL;

    if ('0' <= size[0] && size[0] <= '6')
    {
        int n = size[0] - '0';
        return sizes[n];
    }

    if (size[0] == '-')
    {
        if ('0' <= size[1] && size[1] <= '6')
        {
            int n = size[1] - '0';
            return minussizes[n];
        }
        return "smaller"; /*"70%"; */
    }

    if ('0' <= size[1] && size[1] <= '6')
    {
        int n = size[1] - '0';
        return plussizes[n];
    }

    return "larger"; /* "140%" */
}